

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

void __thiscall Assembler::processSkipSecondPass(Assembler *this,string *line)

{
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  Assembler *this_00;
  char local_41;
  _Alloc_hider local_40;
  undefined8 local_30;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  this_00 = (Assembler *)&stack0xffffffffffffffc0;
  local_40._M_p = (pointer)&stack0xffffffffffffffd0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffc0,pcVar1,pcVar1 + line->_M_string_length);
  iVar2 = literalToDecimal(this_00,(string *)&stack0xffffffffffffffc0);
  if (local_40._M_p != (pointer)&stack0xffffffffffffffd0) {
    operator_delete(local_40._M_p,local_30 + 1);
  }
  locationCounter = locationCounter + iVar2;
  if (iVar2 != 0) {
    do {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
              ::find(&(this->codeBySection)._M_t,&currentSectionName_abi_cxx11_);
      local_41 = '\0';
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                ((vector<char,_std::allocator<char>_> *)(iVar3._M_node + 2),&local_41);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void Assembler::processSkipSecondPass(string line) {
    int value = literalToDecimal(line);
    locationCounter += value;
    while (value--) {
        codeBySection.find(currentSectionName)->second.push_back(0);
    }

}